

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::anon_unknown_26::RegistryHub::registerTest
          (RegistryHub *this,unique_ptr<Catch::TestCaseInfo> *testInfo,
          unique_ptr<Catch::ITestInvoker> *invoker)

{
  unique_ptr<Catch::ITestInvoker> local_18;
  unique_ptr<Catch::TestCaseInfo> local_10;
  
  local_10 = (unique_ptr<Catch::TestCaseInfo>)testInfo->m_ptr;
  testInfo->m_ptr = (TestCaseInfo *)0x0;
  local_18 = (unique_ptr<Catch::ITestInvoker>)invoker->m_ptr;
  invoker->m_ptr = (ITestInvoker *)0x0;
  TestRegistry::registerTest(&this->m_testCaseRegistry,&local_10,&local_18);
  if (local_18.m_ptr != (ITestInvoker *)0x0) {
    (*(local_18.m_ptr)->_vptr_ITestInvoker[2])();
  }
  Detail::unique_ptr<Catch::TestCaseInfo>::~unique_ptr(&local_10);
  return;
}

Assistant:

void registerTest( Detail::unique_ptr<TestCaseInfo>&& testInfo, Detail::unique_ptr<ITestInvoker>&& invoker ) override {
                m_testCaseRegistry.registerTest( CATCH_MOVE(testInfo), CATCH_MOVE(invoker) );
            }